

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::FrameSizeParam,_libaom_test::TestMode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this,
          ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::FrameSizeParam,_libaom_test::TestMode>_>
          *other)

{
  char *__s1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_false>
  _Var2;
  unique_ptr<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  uVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this_00;
  GTestLog local_20;
  GTestLog local_1c;
  
  iVar6 = (*(this->
            super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::FrameSizeParam,_libaom_test::TestMode>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar7 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar4 = IsTrue(CONCAT44(extraout_var,iVar6) == CONCAT44(extraout_var_00,iVar7));
  if (!bVar4) {
    GTestLog::GTestLog(&local_20,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x36f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition BaseGenerator() == other.BaseGenerator() failed. ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The program attempted to compare iterators ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"from different generators.",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    GTestLog::~GTestLog(&local_20);
  }
  __s1 = *(char **)(other->_vptr_ParamIteratorInterface[-1] + 8);
  if (__s1 == 
      "N7testing8internal25CartesianProductGeneratorIJPKN11libaom_test12CodecFactoryEN12_GLOBAL__N_114FrameSizeParamENS2_8TestModeEEE12IteratorImplINS0_13IndexSequenceIJLm0ELm1ELm2EEEEEE"
     ) {
    bVar4 = true;
  }
  else if (*__s1 == '*') {
    bVar4 = false;
  }
  else {
    iVar6 = strcmp(__s1,
                   "N7testing8internal25CartesianProductGeneratorIJPKN11libaom_test12CodecFactoryEN12_GLOBAL__N_114FrameSizeParamENS2_8TestModeEEE12IteratorImplINS0_13IndexSequenceIJLm0ELm1ELm2EEEEEE"
                  );
    bVar4 = iVar6 == 0;
  }
  bVar4 = IsTrue(bVar4);
  if (!bVar4) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x45e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
    GTestLog::~GTestLog(&local_1c);
  }
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *)
            __dynamic_cast(other,&ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::FrameSizeParam,libaom_test::TestMode>>
                                  ::typeinfo,
                           &CartesianProductGenerator<libaom_test::CodecFactory_const*,(anonymous_namespace)::FrameSizeParam,libaom_test::TestMode>
                            ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::typeinfo,
                           0);
  bVar4 = AtEnd(this);
  if ((bVar4) && (bVar4 = AtEnd(this_00), bVar4)) {
    return true;
  }
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       ._M_head_impl;
  if (((_Var1._M_head_impl ==
        ((ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)
        (this_00->current_).
        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
        ._M_head_impl.impl_._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
        )._M_head_impl) ||
      (iVar6 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar6 != '\0')) &&
     ((_Var2._M_head_impl =
            (this->current_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
            .
            super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
            .
            super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_false>
            ._M_head_impl.impl_._M_t.
            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_false>
            ._M_head_impl,
      _Var2._M_head_impl ==
      ((ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam> *)
      (this_00->current_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
      .
      super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
      .
      super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_false>
      )._M_head_impl ||
      (iVar6 = (*(_Var2._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar6 != '\0')))) {
    uVar3._M_t.
    super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
    .
    super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
    ._M_head_impl =
         (this->current_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
         .super__Tuple_impl<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>_>.
         super__Head_base<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
         _M_head_impl.impl_._M_t;
    if ((_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
         )uVar3._M_t.
          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
          .
          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
          ._M_head_impl ==
        (ParamIteratorInterface<libaom_test::TestMode> *)
        *(tuple<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
          *)&(this_00->current_).
             super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
             .
             super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
             .super__Tuple_impl<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>_>.
             super__Head_base<2UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
             _M_head_impl.impl_._M_t) {
      uVar5 = 1;
    }
    else {
      uVar5 = (**(code **)(*(long *)uVar3._M_t.
                                    super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                    .
                                    super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                                    ._M_head_impl + 0x30))();
    }
  }
  else {
    uVar5 = 0;
  }
  return (bool)uVar5;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }